

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_EulerAngles.h
# Opt level: O1

LE_EulerAngles * __thiscall
KDIS::DATA_TYPE::LE_EulerAngles::operator=(LE_EulerAngles *this,LE_EulerAngles *param_1)

{
  DataTypeBase local_80;
  char local_78;
  KFIXED<char,_(unsigned_char)__x03_> local_70;
  DataTypeBase local_60;
  char local_58;
  KFIXED<char,_(unsigned_char)__x03_> local_50;
  DataTypeBase local_40;
  char local_38;
  KFIXED<char,_(unsigned_char)__x03_> local_30;
  
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222c28;
  local_38 = (param_1->m_Psi).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_30,&this->m_Psi);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_40);
  local_60._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222c28;
  local_58 = (param_1->m_Theta).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_50,&this->m_Theta);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60);
  local_80._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00222c28;
  local_78 = (param_1->m_Phi).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_70,&this->m_Phi);
  DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_80);
  return this;
}

Assistant:

class KDIS_EXPORT LE_EulerAngles : public DataTypeBase
{
protected:

    KFIXED8_3 m_Psi;

    KFIXED8_3 m_Theta;

    KFIXED8_3 m_Phi;

public:

    static const KUINT16 LE_EULER_ANGLES_SIZE = 3;

    LE_EulerAngles();

    // In Radians
    explicit LE_EulerAngles(KFIXED8_3 Psi, KFIXED8_3 Theta, KFIXED8_3 Phi);

    explicit LE_EulerAngles(KDataStream &stream) noexcept(false);

    ~LE_EulerAngles() override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::SetPsi
    //              KDIS::DATA_TYPE::LE_EulerAngles::GetPsi
    // Description: Radians / Degrees
    // Parameter:   KFIXED8_3, void
    //************************************
    void SetPsiInRadians( KFIXED8_3 Psi );
    KFIXED8_3 GetPsiInRadians() const;
    void SetPsiInDegrees( KFIXED8_3 Psi );
    KFIXED8_3 GetPsiInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::SetTheta
    //              KDIS::DATA_TYPE::LE_EulerAngles::GetTheta
    // Description: Radians / Degrees
    // Parameter:   KFIXED8_3, void
    //************************************
    void SetThetaInRadians( KFIXED8_3 Theta );
    KFIXED8_3 GetThetaInRadians() const;
    void SetThetaInDegrees( KFIXED8_3 Theta );
    KFIXED8_3 GetThetaInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::SetPhi
    //              KDIS::DATA_TYPE::LE_EulerAngles::GetPhi
    // Description: Radians / Degrees
    // Parameter:   KFIXED8_3, void
    //************************************
    void SetPhiInRadians( KFIXED8_3 Phi );
    KFIXED8_3 GetPhiInRadians() const;
    void SetPhiInDegrees( KFIXED8_3 Phi );
    KFIXED8_3 GetPhiInDegrees() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::GetAsString
    // Description: Returns a string representation.
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::LE_EulerAngles::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const LE_EulerAngles & Value ) const;
    KBOOL operator != ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles operator * ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles operator * ( KFLOAT64 Value ) const ;
    LE_EulerAngles operator + ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles & operator += ( const LE_EulerAngles & Value );
    LE_EulerAngles operator - ( const LE_EulerAngles & Value ) const;
    LE_EulerAngles & operator -= ( const LE_EulerAngles & Value );

    // Valid values 0 - Psi, 1 - Theta, 2 - Phi. throws OUT_OF_BOUNDS exception for any other value.
    KFIXED8_3 &operator[](KUINT16 i) noexcept(false);

    const KFIXED8_3 &operator[](KUINT16 i) const noexcept(false);
}